

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

cf_char_t * cf_strrchr(cf_char_t *s,cf_char_t c)

{
  long lVar1;
  long lVar2;
  
  if (s == (cf_char_t *)0x0) {
    return (cf_char_t *)0x0;
  }
  lVar2 = -1;
  do {
    lVar1 = lVar2 + 1;
    lVar2 = lVar2 + 1;
  } while (s[lVar1] != '\0');
  if (lVar2 != 0) {
    while (s[lVar2] != c) {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) {
        return s;
      }
    }
  }
  return s + lVar2;
}

Assistant:

cf_char_t* cf_strrchr(const cf_char_t* s, cf_char_t c) {
    cf_size_t n;
    if(!s) return CF_NULL_PTR;
    n = cf_strlen(s);
    s += n;
    while(n > 0 && *s != c) n--, s--;
    return (n < 0 ? CF_NULL_PTR : (cf_char_t*)s);
}